

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Declaration_Type.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,TypeDeclarationSymbol *tyDecl)

{
  TypeDeclarationCategory TVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  char *pcVar4;
  
  if (tyDecl == (TypeDeclarationSymbol *)0x0) {
    pcVar4 = "<TypeDeclaration is null>";
  }
  else {
    TVar1 = TypeDeclarationSymbol::category(tyDecl);
    if (TVar1 == Typedef) {
      iVar2 = (*(tyDecl->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x23])(tyDecl);
      poVar3 = operator<<(os,(TypedefDeclarationSymbol *)CONCAT44(extraout_var_00,iVar2));
      return poVar3;
    }
    if (TVar1 == Tag) {
      iVar2 = (*(tyDecl->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x19])(tyDecl);
      poVar3 = operator<<(os,(TagDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
      return poVar3;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/Declaration_Type.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x4c);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"<empty message>");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar4 = "<invalid TypeDeclaration>";
  }
  poVar3 = std::operator<<(os,pcVar4);
  return poVar3;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TypeDeclarationSymbol* tyDecl)
{
    if (!tyDecl)
        return os << "<TypeDeclaration is null>";
    switch (tyDecl->category()) {
        case TypeDeclarationCategory::Tag:
            return os << tyDecl->asTagTypeDeclaration();
        case TypeDeclarationCategory::Typedef:
            return os << tyDecl->asTypedefDeclaration();
    }
    PSY_ASSERT_1(false);
    return os << "<invalid TypeDeclaration>";
}